

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3SetHasNullFlag(Vdbe *v,int iCur,int regHasNull)

{
  int addr;
  
  sqlite3VdbeAddOp2(v,0x47,0,regHasNull);
  addr = sqlite3VdbeAddOp1(v,0x24,iCur);
  sqlite3VdbeAddOp3(v,0x5e,iCur,0,regHasNull);
  if (0 < (long)v->nOp) {
    v->aOp[(long)v->nOp + -1].p5 = 0x80;
  }
  sqlite3VdbeJumpHere(v,addr);
  return;
}

Assistant:

static void sqlite3SetHasNullFlag(Vdbe *v, int iCur, int regHasNull){
  int addr1;
  sqlite3VdbeAddOp2(v, OP_Integer, 0, regHasNull);
  addr1 = sqlite3VdbeAddOp1(v, OP_Rewind, iCur); VdbeCoverage(v);
  sqlite3VdbeAddOp3(v, OP_Column, iCur, 0, regHasNull);
  sqlite3VdbeChangeP5(v, OPFLAG_TYPEOFARG);
  VdbeComment((v, "first_entry_in(%d)", iCur));
  sqlite3VdbeJumpHere(v, addr1);
}